

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::AggregateMessageSet::_InternalSerialize
          (AggregateMessageSet *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  AggregateMessageSet *extendee;
  uint8_t *puVar1;
  UnknownFieldSet *unknown_fields;
  AggregateMessageSet *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  AggregateMessageSet *this_local;
  
  extendee = default_instance();
  puVar1 = google::protobuf::internal::ExtensionSet::
           InternalSerializeMessageSetWithCachedSizesToArray
                     (&(this->field_0)._impl_._extensions_,(MessageLite *)extendee,target,stream);
  unknown_fields =
       google::protobuf::internal::InternalMetadata::
       unknown_fields<google::protobuf::UnknownFieldSet>
                 (&(this->super_Message).super_MessageLite._internal_metadata_,
                  google::protobuf::UnknownFieldSet::default_instance);
  puVar1 = google::protobuf::internal::InternalSerializeUnknownMessageSetItemsToArray
                     (unknown_fields,puVar1,stream);
  return puVar1;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL AggregateMessageSet::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const AggregateMessageSet& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
   target =
      this_._impl_._extensions_
          .InternalSerializeMessageSetWithCachedSizesToArray(
              &default_instance(), target, stream);
  target = ::_pbi::InternalSerializeUnknownMessageSetItemsToArray(
      this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  return target;
}